

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Encrypt0.c
# Opt level: O1

HCOSE_ENCRYPT COSE_Encrypt_Init_From_Object(cn_cbor *cbor,cose_errback *perr)

{
  _Bool _Var1;
  COSE_Encrypt *p;
  cose_errback error;
  cose_errback local_1c;
  
  local_1c.err = COSE_ERR_NONE;
  if (perr == (cose_errback *)0x0) {
    perr = &local_1c;
  }
  p = (COSE_Encrypt *)calloc(1,0x70);
  if (p == (COSE_Encrypt *)0x0) {
    perr->err = COSE_ERR_OUT_OF_MEMORY;
  }
  else {
    _Var1 = _COSE_Init_From_Object((COSE *)p,cbor,perr);
    if (_Var1) {
      _COSE_InsertInList(&EncryptRoot,(COSE *)p);
      return (HCOSE_ENCRYPT)p;
    }
  }
  if (p != (COSE_Encrypt *)0x0) {
    _COSE_Encrypt_Release(p);
    free(p);
  }
  return (HCOSE_ENCRYPT)0x0;
}

Assistant:

HCOSE_ENCRYPT COSE_Encrypt_Init_From_Object(cn_cbor * cbor, CBOR_CONTEXT_COMMA cose_errback * perr)
{
    COSE_Encrypt * pobj;

    cose_errback error = { 0 };
    if (perr == NULL) perr = &error;

    pobj = (COSE_Encrypt *) COSE_CALLOC(1, sizeof(COSE_Encrypt), context);
    if (pobj == NULL) {
        perr->err = COSE_ERR_OUT_OF_MEMORY;
    errorReturn:
        if (pobj != NULL) {
            _COSE_Encrypt_Release(pobj);
            COSE_FREE(pobj, context);
        }
        return NULL;
    }

    if (!_COSE_Init_From_Object(&pobj->m_message, cbor, CBOR_CONTEXT_PARAM_COMMA perr)) {
        goto errorReturn;
    }

    _COSE_InsertInList(&EncryptRoot, &pobj->m_message);

    return(HCOSE_ENCRYPT) pobj;
    
}